

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectAnimationTicksPerSecond(CXMeshFileLoader *this)

{
  bool bVar1;
  u32 uVar2;
  long in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  u32 ticks;
  CXMeshFileLoader *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff9c;
  CXMeshFileLoader *in_stack_ffffffffffffffa0;
  CXMeshFileLoader *in_stack_ffffffffffffffa8;
  stringc *in_stack_ffffffffffffffd0;
  CXMeshFileLoader *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = readHeadOfDataObject(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (bVar1) {
    uVar2 = readInt(in_stack_ffffffffffffff88);
    bVar1 = checkForOneFollowingSemicolons(in_stack_ffffffffffffffa8);
    if (bVar1) {
      bVar1 = checkForClosingBrace(in_stack_ffffffffffffffa0);
      if (bVar1) {
        (**(code **)(**(long **)(in_RDI + 8) + 0x60))((float)uVar2);
        local_1 = true;
      }
      else {
        os::Printer::log((Printer *)"No closing brace in AnimationTicksPerSecond in x file",__x_03);
        core::string<char>::string
                  ((string<char> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        core::string<char>::c_str((string<char> *)0x2e602c);
        os::Printer::log(__x_04);
        core::string<char>::~string((string<char> *)0x2e604a);
        *(undefined1 *)(in_RDI + 0x50) = 1;
        local_1 = false;
      }
    }
    else {
      os::Printer::log((Printer *)"No closing semicolon in AnimationTicksPerSecond in x file",__x_01
                      );
      core::string<char>::string
                ((string<char> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      core::string<char>::c_str((string<char> *)0x2e5fbd);
      os::Printer::log(__x_02);
      core::string<char>::~string((string<char> *)0x2e5fdb);
      *(undefined1 *)(in_RDI + 0x50) = 1;
      local_1 = false;
    }
  }
  else {
    os::Printer::log((Printer *)"No opening brace in Animation found in x file",__x);
    core::string<char>::string((string<char> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    core::string<char>::c_str((string<char> *)0x2e5f40);
    os::Printer::log(__x_00);
    core::string<char>::~string((string<char> *)0x2e5f5e);
    *(undefined1 *)(in_RDI + 0x50) = 1;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectAnimationTicksPerSecond()
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading AnimationTicksPerSecond", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Animation found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	const u32 ticks = readInt();

	if (!checkForOneFollowingSemicolons()) {
		os::Printer::log("No closing semicolon in AnimationTicksPerSecond in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in AnimationTicksPerSecond in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	AnimatedMesh->setAnimationSpeed(static_cast<irr::f32>(ticks));

	return true;
}